

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::Model::ByteSizeLong(Model *this)

{
  bool bVar1;
  int32 iVar2;
  TypeCase TVar3;
  int iVar4;
  size_t sVar5;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  Model *this_local;
  
  sStack_18 = 0;
  bVar1 = has_description(this);
  if (bVar1) {
    sStack_18 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::ModelDescription>(this->description_);
    sStack_18 = sStack_18 + 1;
  }
  iVar2 = specificationversion(this);
  if (iVar2 != 0) {
    iVar2 = specificationversion(this);
    sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar2);
    sStack_18 = sVar5 + 1 + sStack_18;
  }
  bVar1 = isupdatable(this);
  if (bVar1) {
    sStack_18 = sStack_18 + 2;
  }
  TVar3 = Type_case(this);
  if (TVar3 != TYPE_NOT_SET) {
    if (TVar3 == kPipelineClassifier) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::PipelineClassifier>
                        ((this->Type_).pipelineclassifier_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kPipelineRegressor) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::PipelineRegressor>
                        ((this->Type_).pipelineregressor_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kPipeline) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::Pipeline>((this->Type_).pipeline_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kGlmRegressor) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::GLMRegressor>((this->Type_).glmregressor_)
      ;
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kSupportVectorRegressor) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::SupportVectorRegressor>
                        ((this->Type_).supportvectorregressor_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kTreeEnsembleRegressor) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::TreeEnsembleRegressor>
                        ((this->Type_).treeensembleregressor_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kNeuralNetworkRegressor) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::NeuralNetworkRegressor>
                        ((this->Type_).neuralnetworkregressor_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kBayesianProbitRegressor) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::BayesianProbitRegressor>
                        ((this->Type_).bayesianprobitregressor_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kGlmClassifier) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::GLMClassifier>
                        ((this->Type_).glmclassifier_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kSupportVectorClassifier) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::SupportVectorClassifier>
                        ((this->Type_).supportvectorclassifier_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kTreeEnsembleClassifier) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::TreeEnsembleClassifier>
                        ((this->Type_).treeensembleclassifier_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kNeuralNetworkClassifier) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::NeuralNetworkClassifier>
                        ((this->Type_).neuralnetworkclassifier_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kKNearestNeighborsClassifier) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::KNearestNeighborsClassifier>
                        ((this->Type_).knearestneighborsclassifier_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kNeuralNetwork) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::NeuralNetwork>
                        ((this->Type_).neuralnetwork_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kItemSimilarityRecommender) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::ItemSimilarityRecommender>
                        ((this->Type_).itemsimilarityrecommender_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kMlProgram) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::MILSpec::Program>
                        ((this->Type_).mlprogram_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kCustomModel) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::CustomModel>((this->Type_).custommodel_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kLinkedModel) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::LinkedModel>((this->Type_).linkedmodel_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kOneHotEncoder) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::OneHotEncoder>
                        ((this->Type_).onehotencoder_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kImputer) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::Imputer>((this->Type_).imputer_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kFeatureVectorizer) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::FeatureVectorizer>
                        ((this->Type_).featurevectorizer_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kDictVectorizer) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::DictVectorizer>
                        ((this->Type_).dictvectorizer_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kScaler) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::Scaler>((this->Type_).scaler_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kCategoricalMapping) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::CategoricalMapping>
                        ((this->Type_).categoricalmapping_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kNormalizer) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::Normalizer>((this->Type_).normalizer_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kArrayFeatureExtractor) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::ArrayFeatureExtractor>
                        ((this->Type_).arrayfeatureextractor_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kNonMaximumSuppression) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::NonMaximumSuppression>
                        ((this->Type_).nonmaximumsuppression_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kIdentity) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::Identity>((this->Type_).identity_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kTextClassifier) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::CoreMLModels::TextClassifier>
                        ((this->Type_).textclassifier_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kWordTagger) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::CoreMLModels::WordTagger>
                        ((this->Type_).wordtagger_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kVisionFeaturePrint) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::CoreMLModels::VisionFeaturePrint>
                        ((this->Type_).visionfeatureprint_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kSoundAnalysisPreprocessing) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing>
                        ((this->Type_).soundanalysispreprocessing_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kGazetteer) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::CoreMLModels::Gazetteer>
                        ((this->Type_).gazetteer_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kWordEmbedding) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::CoreMLModels::WordEmbedding>
                        ((this->Type_).wordembedding_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kAudioFeaturePrint) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::CoreMLModels::AudioFeaturePrint>
                        ((this->Type_).audiofeatureprint_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (TVar3 == kSerializedModel) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::SerializedModel>
                        ((this->Type_).serializedmodel_);
      sStack_18 = sVar5 + 3 + sStack_18;
    }
  }
  iVar4 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar4;
  return sStack_18;
}

Assistant:

size_t Model::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.Model)
  size_t total_size = 0;

  // .CoreML.Specification.ModelDescription description = 2;
  if (this->has_description()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->description_);
  }

  // int32 specificationVersion = 1;
  if (this->specificationversion() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->specificationversion());
  }

  // bool isUpdatable = 10;
  if (this->isupdatable() != 0) {
    total_size += 1 + 1;
  }

  switch (Type_case()) {
    // .CoreML.Specification.PipelineClassifier pipelineClassifier = 200;
    case kPipelineClassifier: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.pipelineclassifier_);
      break;
    }
    // .CoreML.Specification.PipelineRegressor pipelineRegressor = 201;
    case kPipelineRegressor: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.pipelineregressor_);
      break;
    }
    // .CoreML.Specification.Pipeline pipeline = 202;
    case kPipeline: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.pipeline_);
      break;
    }
    // .CoreML.Specification.GLMRegressor glmRegressor = 300;
    case kGlmRegressor: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.glmregressor_);
      break;
    }
    // .CoreML.Specification.SupportVectorRegressor supportVectorRegressor = 301;
    case kSupportVectorRegressor: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.supportvectorregressor_);
      break;
    }
    // .CoreML.Specification.TreeEnsembleRegressor treeEnsembleRegressor = 302;
    case kTreeEnsembleRegressor: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.treeensembleregressor_);
      break;
    }
    // .CoreML.Specification.NeuralNetworkRegressor neuralNetworkRegressor = 303;
    case kNeuralNetworkRegressor: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.neuralnetworkregressor_);
      break;
    }
    // .CoreML.Specification.BayesianProbitRegressor bayesianProbitRegressor = 304;
    case kBayesianProbitRegressor: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.bayesianprobitregressor_);
      break;
    }
    // .CoreML.Specification.GLMClassifier glmClassifier = 400;
    case kGlmClassifier: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.glmclassifier_);
      break;
    }
    // .CoreML.Specification.SupportVectorClassifier supportVectorClassifier = 401;
    case kSupportVectorClassifier: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.supportvectorclassifier_);
      break;
    }
    // .CoreML.Specification.TreeEnsembleClassifier treeEnsembleClassifier = 402;
    case kTreeEnsembleClassifier: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.treeensembleclassifier_);
      break;
    }
    // .CoreML.Specification.NeuralNetworkClassifier neuralNetworkClassifier = 403;
    case kNeuralNetworkClassifier: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.neuralnetworkclassifier_);
      break;
    }
    // .CoreML.Specification.KNearestNeighborsClassifier kNearestNeighborsClassifier = 404;
    case kKNearestNeighborsClassifier: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.knearestneighborsclassifier_);
      break;
    }
    // .CoreML.Specification.NeuralNetwork neuralNetwork = 500;
    case kNeuralNetwork: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.neuralnetwork_);
      break;
    }
    // .CoreML.Specification.ItemSimilarityRecommender itemSimilarityRecommender = 501;
    case kItemSimilarityRecommender: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.itemsimilarityrecommender_);
      break;
    }
    // .CoreML.Specification.MILSpec.Program mlProgram = 502;
    case kMlProgram: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.mlprogram_);
      break;
    }
    // .CoreML.Specification.CustomModel customModel = 555;
    case kCustomModel: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.custommodel_);
      break;
    }
    // .CoreML.Specification.LinkedModel linkedModel = 556;
    case kLinkedModel: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.linkedmodel_);
      break;
    }
    // .CoreML.Specification.OneHotEncoder oneHotEncoder = 600;
    case kOneHotEncoder: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.onehotencoder_);
      break;
    }
    // .CoreML.Specification.Imputer imputer = 601;
    case kImputer: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.imputer_);
      break;
    }
    // .CoreML.Specification.FeatureVectorizer featureVectorizer = 602;
    case kFeatureVectorizer: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.featurevectorizer_);
      break;
    }
    // .CoreML.Specification.DictVectorizer dictVectorizer = 603;
    case kDictVectorizer: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.dictvectorizer_);
      break;
    }
    // .CoreML.Specification.Scaler scaler = 604;
    case kScaler: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.scaler_);
      break;
    }
    // .CoreML.Specification.CategoricalMapping categoricalMapping = 606;
    case kCategoricalMapping: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.categoricalmapping_);
      break;
    }
    // .CoreML.Specification.Normalizer normalizer = 607;
    case kNormalizer: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.normalizer_);
      break;
    }
    // .CoreML.Specification.ArrayFeatureExtractor arrayFeatureExtractor = 609;
    case kArrayFeatureExtractor: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.arrayfeatureextractor_);
      break;
    }
    // .CoreML.Specification.NonMaximumSuppression nonMaximumSuppression = 610;
    case kNonMaximumSuppression: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.nonmaximumsuppression_);
      break;
    }
    // .CoreML.Specification.Identity identity = 900;
    case kIdentity: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.identity_);
      break;
    }
    // .CoreML.Specification.CoreMLModels.TextClassifier textClassifier = 2000;
    case kTextClassifier: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.textclassifier_);
      break;
    }
    // .CoreML.Specification.CoreMLModels.WordTagger wordTagger = 2001;
    case kWordTagger: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.wordtagger_);
      break;
    }
    // .CoreML.Specification.CoreMLModels.VisionFeaturePrint visionFeaturePrint = 2002;
    case kVisionFeaturePrint: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.visionfeatureprint_);
      break;
    }
    // .CoreML.Specification.CoreMLModels.SoundAnalysisPreprocessing soundAnalysisPreprocessing = 2003;
    case kSoundAnalysisPreprocessing: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.soundanalysispreprocessing_);
      break;
    }
    // .CoreML.Specification.CoreMLModels.Gazetteer gazetteer = 2004;
    case kGazetteer: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.gazetteer_);
      break;
    }
    // .CoreML.Specification.CoreMLModels.WordEmbedding wordEmbedding = 2005;
    case kWordEmbedding: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.wordembedding_);
      break;
    }
    // .CoreML.Specification.CoreMLModels.AudioFeaturePrint audioFeaturePrint = 2006;
    case kAudioFeaturePrint: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.audiofeatureprint_);
      break;
    }
    // .CoreML.Specification.SerializedModel serializedModel = 3000;
    case kSerializedModel: {
      total_size += 3 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.serializedmodel_);
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}